

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O2

Am_Value get_other_form_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  ushort in_SI;
  Am_Value AVar2;
  Am_Object other;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  other.data = (Am_Object_Data *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(in_SI,0x16d);
  Am_Object::operator=(&other,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&other,0x169);
  Am_Value::operator=((Am_Value *)self,pAVar1);
  Am_Object::~Am_Object(&other);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

Am_Define_Formula(Am_Value, get_other_form)
{
  Am_Value value;
  Am_Object other;
  other = self.Get(Am_OBJECT_MODIFIED);
  value = other.Peek(Am_VALUE);
  return value;
}